

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfBoxAttribute.cpp
# Opt level: O0

void __thiscall
Imf_2_5::TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<float>_>_>::writeValueTo
          (TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<float>_>_> *this,OStream *os,int version)

{
  OStream *in_RDI;
  float in_stack_ffffffffffffffdc;
  
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(in_RDI,in_stack_ffffffffffffffdc);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(in_RDI,in_stack_ffffffffffffffdc);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(in_RDI,in_stack_ffffffffffffffdc);
  Xdr::write<Imf_2_5::StreamIO,Imf_2_5::OStream>(in_RDI,in_stack_ffffffffffffffdc);
  return;
}

Assistant:

void
Box2fAttribute::writeValueTo (OPENEXR_IMF_INTERNAL_NAMESPACE::OStream &os, int version) const
{
    Xdr::write <StreamIO> (os, _value.min.x);
    Xdr::write <StreamIO> (os, _value.min.y);
    Xdr::write <StreamIO> (os, _value.max.x);
    Xdr::write <StreamIO> (os, _value.max.y);
}